

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O1

void __thiscall
JobQueue::setupJobStealing
          (JobQueue *this,cbtAlignedObjectArray<JobQueue> *contextArray,int numActiveContexts)

{
  int iVar1;
  int iVar2;
  JobQueue **ppJVar3;
  JobQueue **ppJVar4;
  long lVar5;
  uint uVar6;
  JobQueue *pJVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int i;
  
  iVar1 = contextArray->m_size;
  if (0 < (long)iVar1) {
    pJVar7 = contextArray->m_data + -1;
    lVar12 = 0;
    do {
      pJVar7 = pJVar7 + 1;
      if (pJVar7 == this) goto LAB_0091e8b0;
      lVar12 = lVar12 + 1;
    } while (iVar1 != lVar12);
  }
  lVar12 = 0;
LAB_0091e8b0:
  iVar11 = 3;
  if (iVar1 < 3) {
    iVar11 = iVar1;
  }
  iVar11 = iVar11 + -1;
  if ((this->m_neighborContexts).m_capacity < iVar11) {
    if (iVar11 == 0) {
      ppJVar4 = (JobQueue **)0x0;
    }
    else {
      ppJVar4 = (JobQueue **)cbtAlignedAllocInternal((long)iVar11 << 3,0x10);
    }
    lVar5 = (long)(this->m_neighborContexts).m_size;
    if (0 < lVar5) {
      lVar8 = 0;
      do {
        ppJVar4[lVar8] = (this->m_neighborContexts).m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar5 != lVar8);
    }
    ppJVar3 = (this->m_neighborContexts).m_data;
    if (ppJVar3 != (JobQueue **)0x0) {
      if ((this->m_neighborContexts).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ppJVar3);
      }
      (this->m_neighborContexts).m_data = (JobQueue **)0x0;
    }
    (this->m_neighborContexts).m_ownsMemory = true;
    (this->m_neighborContexts).m_data = ppJVar4;
    (this->m_neighborContexts).m_capacity = iVar11;
  }
  if (((this->m_neighborContexts).m_size < 0) && ((this->m_neighborContexts).m_capacity < 0)) {
    ppJVar4 = (this->m_neighborContexts).m_data;
    if (ppJVar4 != (JobQueue **)0x0) {
      if ((this->m_neighborContexts).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ppJVar4);
      }
      (this->m_neighborContexts).m_data = (JobQueue **)0x0;
    }
    (this->m_neighborContexts).m_ownsMemory = true;
    (this->m_neighborContexts).m_data = (JobQueue **)0x0;
    (this->m_neighborContexts).m_capacity = 0;
  }
  (this->m_neighborContexts).m_size = 0;
  lVar5 = 0;
  do {
    iVar1 = (this->m_neighborContexts).m_size;
    if (iVar11 <= iVar1) {
      return;
    }
    uVar6 = (&DAT_00a17bf0)[lVar5] + (int)lVar12;
    if ((int)uVar6 < numActiveContexts && -1 < (int)uVar6) {
      pJVar7 = contextArray->m_data;
      iVar2 = (this->m_neighborContexts).m_capacity;
      if (iVar1 == iVar2) {
        iVar10 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar10 = 1;
        }
        if (iVar2 < iVar10) {
          if (iVar10 == 0) {
            ppJVar4 = (JobQueue **)0x0;
          }
          else {
            ppJVar4 = (JobQueue **)cbtAlignedAllocInternal((long)iVar10 << 3,0x10);
          }
          lVar8 = (long)(this->m_neighborContexts).m_size;
          if (0 < lVar8) {
            lVar9 = 0;
            do {
              ppJVar4[lVar9] = (this->m_neighborContexts).m_data[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar8 != lVar9);
          }
          ppJVar3 = (this->m_neighborContexts).m_data;
          if (ppJVar3 != (JobQueue **)0x0) {
            if ((this->m_neighborContexts).m_ownsMemory == true) {
              cbtAlignedFreeInternal(ppJVar3);
            }
            (this->m_neighborContexts).m_data = (JobQueue **)0x0;
          }
          (this->m_neighborContexts).m_ownsMemory = true;
          (this->m_neighborContexts).m_data = ppJVar4;
          (this->m_neighborContexts).m_capacity = iVar10;
        }
      }
      iVar1 = (this->m_neighborContexts).m_size;
      (this->m_neighborContexts).m_data[iVar1] = pJVar7 + uVar6;
      (this->m_neighborContexts).m_size = iVar1 + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  return;
}

Assistant:

void setupJobStealing(cbtAlignedObjectArray<JobQueue> * contextArray, int numActiveContexts)
	{
		cbtAlignedObjectArray<JobQueue>& contexts = *contextArray;
		int selfIndex = 0;
		for (int i = 0; i < contexts.size(); ++i)
		{
			if (this == &contexts[i])
			{
				selfIndex = i;
				break;
			}
		}
		int numNeighbors = cbtMin(2, contexts.size() - 1);
		int neighborOffsets[] = {-1, 1, -2, 2, -3, 3};
		int numOffsets = sizeof(neighborOffsets) / sizeof(neighborOffsets[0]);
		m_neighborContexts.reserve(numNeighbors);
		m_neighborContexts.resizeNoInitialize(0);
		for (int i = 0; i < numOffsets && m_neighborContexts.size() < numNeighbors; i++)
		{
			int neighborIndex = selfIndex + neighborOffsets[i];
			if (neighborIndex >= 0 && neighborIndex < numActiveContexts)
			{
				m_neighborContexts.push_back(&contexts[neighborIndex]);
			}
		}
	}